

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vulnerabilitytobin.cpp
# Opt level: O0

void __thiscall VulnerabilityToBin::~VulnerabilityToBin(VulnerabilityToBin *this)

{
  VulnerabilityToBin *this_local;
  
  (this->super_ValidateVulnerability)._vptr_ValidateVulnerability =
       (_func_int **)&PTR_WriteBinVulnerabilityFile_00110d10;
  fclose((FILE *)this->fileOutBin_);
  if (((this->super_ValidateVulnerability).useIndexFile_ & 1U) != 0) {
    fclose((FILE *)this->fileOutIdx_);
  }
  std::vector<VulnerabilityRow,_std::allocator<VulnerabilityRow>_>::~vector
            (&this->vulnerabilityRows_);
  ValidateVulnerability::~ValidateVulnerability(&this->super_ValidateVulnerability);
  return;
}

Assistant:

VulnerabilityToBin::~VulnerabilityToBin() {

  fclose(fileOutBin_);
  if (useIndexFile_) fclose(fileOutIdx_);

}